

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_ahustore(ASMState *as,IRIns *ir)

{
  ushort uVar1;
  IRIns *pIVar2;
  uint local_40;
  RegSet local_3c;
  Reg src_1;
  RegSet allow;
  IRIns *irr;
  TValue k;
  IRIns *pIStack_20;
  Reg src;
  IRIns *ir_local;
  ASMState *as_local;
  
  if ((ir->field_1).r != 0xfe) {
    pIStack_20 = ir;
    ir_local = (IRIns *)as;
    if (((ir->field_1).t.irt & 0x1f) == 0xe) {
      k.field_4.it = ra_alloc1(as,(uint)(ir->field_0).op2,0xffff0000);
      asm_fuseahuref((ASMState *)&ir_local->field_0,(uint)(pIStack_20->field_0).op1,0xbfef);
      emit_mrm((ASMState *)&ir_local->field_0,XO_MOVSDto,k.field_4.it,0x20);
    }
    else if ((ir->field_0).op2 < 0x8000) {
      lj_ir_kvalue(as->J->L,(TValue *)&irr,as->ir + (ir->field_0).op2);
      asm_fuseahuref((ASMState *)&ir_local->field_0,(uint)(pIStack_20->field_0).op1,0xbfef);
      if (CONCAT44(irr._4_4_,irr._0_4_) == -1) {
        *(undefined4 *)((long)ir_local[0x10] + -4) = 0xffffffff;
        ir_local[0x10] = (IRIns)(ir_local[0x10] + -4);
        emit_mrm((ASMState *)&ir_local->field_0,XO_MOVmi,0x80200,0x20);
      }
      else {
        *(undefined4 *)((long)ir_local[0x10] + -4) = irr._0_4_;
        ir_local[0x10] = (IRIns)(ir_local[0x10] + -4);
        emit_mrm((ASMState *)&ir_local->field_0,XO_MOVmi,0,0x20);
        ir_local[0x14].field_1.op12 = ir_local[0x14].field_1.op12 + 4;
        *(undefined4 *)((long)ir_local[0x10] + -4) = irr._4_4_;
        ir_local[0x10] = (IRIns)(ir_local[0x10] + -4);
        emit_mrm((ASMState *)&ir_local->field_0,XO_MOVmi,0,0x20);
      }
    }
    else {
      pIVar2 = as->ir;
      uVar1 = (ir->field_0).op2;
      local_3c = 0xbfef;
      local_40 = 0x80;
      if (0x7fff < (ir->field_0).op2) {
        local_40 = ra_alloc1(as,(uint)(ir->field_0).op2,0xbfef);
        local_3c = (1 << ((byte)local_40 & 0x1f) ^ 0xffffffffU) & 0xbfef;
      }
      asm_fuseahuref((ASMState *)&ir_local->field_0,(uint)(pIStack_20->field_0).op1,local_3c);
      if ((local_40 & 0x80) == 0) {
        ir_local[0x14].field_1.op12 = ir_local[0x14].field_1.op12 + 4;
        as_local._4_4_ = (pIStack_20->field_1).t.irt & 0x1f;
        *(uint *)((long)ir_local[0x10] + -4) = (as_local._4_4_ ^ 0xffffffff) << 0xf;
        ir_local[0x10] = (IRIns)(ir_local[0x10] + -4);
        emit_mrm((ASMState *)&ir_local->field_0,XO_ARITHi,1,0x20);
        ir_local[0x14].field_1.op12 = ir_local[0x14].field_1.op12 - 4;
        emit_mrm((ASMState *)&ir_local->field_0,XO_MOVto,local_40 | 0x80200,0x20);
      }
      else {
        if (2 < (pIVar2[uVar1].field_1.t.irt & 0x1f)) {
          *(IRRef2 *)((long)ir_local[0x10] + -4) = pIVar2[uVar1].field_1.op12;
          ir_local[0x10] = (IRIns)(ir_local[0x10] + -4);
          emit_mrm((ASMState *)&ir_local->field_0,XO_MOVmi,0,0x20);
        }
        ir_local[0x14].field_1.op12 = ir_local[0x14].field_1.op12 + 4;
        *(undefined4 *)((long)ir_local[0x10] + -4) = 0xfff90000;
        ir_local[0x10] = (IRIns)(ir_local[0x10] + -4);
        emit_mrm((ASMState *)&ir_local->field_0,XO_MOVmi,0,0x20);
      }
    }
  }
  return;
}

Assistant:

static void asm_ahustore(ASMState *as, IRIns *ir)
{
  if (ir->r == RID_SINK)
    return;
  if (irt_isnum(ir->t)) {
    Reg src = ra_alloc1(as, ir->op2, RSET_FPR);
    asm_fuseahuref(as, ir->op1, RSET_GPR);
    emit_mrm(as, XO_MOVSDto, src, RID_MRM);
#if LJ_64 && !LJ_GC64
  } else if (irt_islightud(ir->t)) {
    Reg src = ra_alloc1(as, ir->op2, RSET_GPR);
    asm_fuseahuref(as, ir->op1, rset_exclude(RSET_GPR, src));
    emit_mrm(as, XO_MOVto, src|REX_64, RID_MRM);
#endif
#if LJ_GC64
  } else if (irref_isk(ir->op2)) {
    TValue k;
    lj_ir_kvalue(as->J->L, &k, IR(ir->op2));
    asm_fuseahuref(as, ir->op1, RSET_GPR);
    if (tvisnil(&k)) {
      emit_i32(as, -1);
      emit_mrm(as, XO_MOVmi, REX_64, RID_MRM);
    } else {
      emit_u32(as, k.u32.lo);
      emit_mrm(as, XO_MOVmi, 0, RID_MRM);
      as->mrm.ofs += 4;
      emit_u32(as, k.u32.hi);
      emit_mrm(as, XO_MOVmi, 0, RID_MRM);
    }
#endif
  } else {
    IRIns *irr = IR(ir->op2);
    RegSet allow = RSET_GPR;
    Reg src = RID_NONE;
    if (!irref_isk(ir->op2)) {
      src = ra_alloc1(as, ir->op2, allow);
      rset_clear(allow, src);
    }
    asm_fuseahuref(as, ir->op1, allow);
    if (ra_hasreg(src)) {
#if LJ_GC64
      if (!(LJ_DUALNUM && irt_isinteger(ir->t))) {
	/* TODO: 64 bit store + 32 bit load-modify-store is suboptimal. */
	as->mrm.ofs += 4;
	emit_u32(as, irt_toitype(ir->t) << 15);
	emit_mrm(as, XO_ARITHi, XOg_OR, RID_MRM);
	as->mrm.ofs -= 4;
	emit_mrm(as, XO_MOVto, src|REX_64, RID_MRM);
	return;
      }
#endif
      emit_mrm(as, XO_MOVto, src, RID_MRM);
    } else if (!irt_ispri(irr->t)) {
      lj_assertA(irt_isaddr(ir->t) || (LJ_DUALNUM && irt_isinteger(ir->t)),
		 "bad store type");
      emit_i32(as, irr->i);
      emit_mrm(as, XO_MOVmi, 0, RID_MRM);
    }
    as->mrm.ofs += 4;
#if LJ_GC64
    lj_assertA(LJ_DUALNUM && irt_isinteger(ir->t), "bad store type");
    emit_i32(as, LJ_TNUMX << 15);
#else
    emit_i32(as, (int32_t)irt_toitype(ir->t));
#endif
    emit_mrm(as, XO_MOVmi, 0, RID_MRM);
  }
}